

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O0

CTState * lj_ctype_init(lua_State *L)

{
  uint uVar1;
  CTState *cts_00;
  size_t sVar2;
  GCstr *pGVar3;
  long in_RDI;
  GCstr *str;
  size_t len;
  CTInfo info;
  CTypeID id;
  char *name;
  CType *ct;
  CTState *cts;
  undefined8 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  uint id_00;
  lua_State *in_stack_ffffffffffffffd0;
  char *__s;
  CType *local_28;
  
  cts_00 = (CTState *)
           lj_mem_realloc(in_stack_ffffffffffffffd0,
                          (void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                          (GCSize)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                          (GCSize)in_stack_ffffffffffffffc0);
  local_28 = (CType *)lj_mem_realloc(in_stack_ffffffffffffffd0,
                                     (void *)CONCAT44(in_stack_ffffffffffffffcc,
                                                      in_stack_ffffffffffffffc8),
                                     (GCSize)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                                     (GCSize)in_stack_ffffffffffffffc0);
  __s = "va_list";
  memset(cts_00,0,0x1d0);
  cts_00->tab = local_28;
  cts_00->sizetab = 0x80;
  cts_00->top = 0x60;
  cts_00->L = (lua_State *)0x0;
  cts_00->g = (global_State *)(ulong)*(uint *)(in_RDI + 8);
  for (id_00 = 0; id_00 < 0x60; id_00 = id_00 + 1) {
    uVar1 = lj_ctype_typeinfo[id_00];
    local_28->size = (int)(uVar1 << 0x10) >> 0x1a;
    local_28->info = uVar1 & 0xffff03ff;
    local_28->sib = 0;
    if ((uVar1 >> 0x1c == 0xd) || (uVar1 >> 0x1c == 7)) {
      sVar2 = strlen(__s);
      pGVar3 = lj_str_new(L,(char *)cts,(size_t)ct);
      pGVar3->marked = pGVar3->marked | 0x20;
      (local_28->name).gcptr32 = (uint32_t)pGVar3;
      __s = __s + sVar2 + 1;
      lj_ctype_addname(cts_00,local_28,id_00);
    }
    else {
      (local_28->name).gcptr32 = 0;
      local_28->next = 0;
      if (uVar1 >> 0x1c != 5) {
        ctype_addtype(cts_00,local_28,id_00);
      }
    }
    local_28 = local_28 + 1;
  }
  *(int *)((ulong)*(uint *)(in_RDI + 8) + 0x194) = (int)cts_00;
  return cts_00;
}

Assistant:

CTState *lj_ctype_init(lua_State *L)
{
  CTState *cts = lj_mem_newt(L, sizeof(CTState), CTState);
  CType *ct = lj_mem_newvec(L, CTTYPETAB_MIN, CType);
  const char *name = lj_ctype_typenames;
  CTypeID id;
  memset(cts, 0, sizeof(CTState));
  cts->tab = ct;
  cts->sizetab = CTTYPETAB_MIN;
  cts->top = CTTYPEINFO_NUM;
  cts->L = NULL;
  cts->g = G(L);
  for (id = 0; id < CTTYPEINFO_NUM; id++, ct++) {
    CTInfo info = lj_ctype_typeinfo[id];
    ct->size = (CTSize)((int32_t)(info << 16) >> 26);
    ct->info = info & 0xffff03ffu;
    ct->sib = 0;
    if (ctype_type(info) == CT_KW || ctype_istypedef(info)) {
      size_t len = strlen(name);
      GCstr *str = lj_str_new(L, name, len);
      ctype_setname(ct, str);
      name += len+1;
      lj_ctype_addname(cts, ct, id);
    } else {
      setgcrefnull(ct->name);
      ct->next = 0;
      if (!ctype_isenum(info)) ctype_addtype(cts, ct, id);
    }
  }
  setmref(G(L)->ctype_state, cts);
  return cts;
}